

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

void burstsort_superalphabet_vector(uchar **strings,size_t n)

{
  _WordT *p_Var1;
  ushort uVar2;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *p_Var3;
  TrieNode<unsigned_short> *pTVar4;
  byte bVar5;
  _func_void_uchar_ptr_ptr_int_int *small_sort;
  ulong uVar6;
  size_t depth;
  TrieNode<unsigned_short> *pTVar7;
  BurstSimple<unsigned_short> local_61;
  TrieNode<unsigned_short> *local_60;
  uchar **local_58;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_50;
  uchar *str;
  _func_void_uchar_ptr_ptr_int_int *local_40;
  _func_void_uchar_ptr_ptr_int_int *local_38;
  
  local_58 = strings;
  local_40 = (_func_void_uchar_ptr_ptr_int_int *)n;
  local_60 = (TrieNode<unsigned_short> *)operator_new(0x82000);
  TrieNode<unsigned_short>::TrieNode(local_60);
  small_sort = (_func_void_uchar_ptr_ptr_int_int *)0x0;
  do {
    if (small_sort == local_40) {
      traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,void(*)(unsigned_char**,int,int),unsigned_short>
                (local_60,local_58,0,small_sort);
      return;
    }
    str = local_58[(long)small_sort];
    local_38 = small_sort;
    uVar2 = get_char<unsigned_short>(str,0);
    depth = 2;
    pTVar7 = local_60;
    while( true ) {
      uVar6 = (ulong)uVar2;
      bVar5 = (byte)uVar2;
      if (((pTVar7->is_trie).super__Base_bitset<1024UL>._M_w[uVar2 >> 6] >> (uVar6 & 0x3f) & 1) == 0
         ) break;
      if (bVar5 == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                      ,0xdf,
                      "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 32000U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                     );
      }
      pTVar7 = (TrieNode<unsigned_short> *)(pTVar7->buckets)._M_elems[uVar6];
      uVar2 = get_char<unsigned_short>(str,depth);
      depth = depth + 2;
    }
    p_Var3 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (pTVar7->buckets)._M_elems[uVar6];
    if (p_Var3 == (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      p_Var3 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18)
      ;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var3->_M_impl)->
      _M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var3->_M_impl)->
      _M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var3->_M_impl)->
      _M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar7->buckets)._M_elems[uVar6] = p_Var3;
    }
    local_50 = p_Var3;
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)p_Var3,&str);
    if ((bVar5 != 0) &&
       (0x3e800 < (ulong)((long)(((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *
                                  )&local_50->_M_impl)->_M_impl).super__Vector_impl_data._M_finish -
                         (long)(((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                                &local_50->_M_impl)->_M_impl).super__Vector_impl_data._M_start))) {
      pTVar4 = BurstSimple<unsigned_short>::operator()
                         (&local_61,
                          (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_50,
                          depth);
      p_Var3 = local_50;
      (pTVar7->buckets)._M_elems[uVar6] = pTVar4;
      p_Var1 = (pTVar7->is_trie).super__Base_bitset<1024UL>._M_w + (uVar2 >> 6);
      *p_Var1 = *p_Var1 | 1L << (bVar5 & 0x3f);
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(local_50);
      operator_delete(p_Var3);
    }
    small_sort = local_38 + 1;
  } while( true );
}

Assistant:

void burstsort_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<32000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}